

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflateSync(zng_stream *strm)

{
  internal_state *piVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  Pos *pPVar6;
  long lVar7;
  int32_t iVar8;
  size_t sVar9;
  uchar buf [4];
  uint8_t local_34 [4];
  
  iVar3 = inflateStateCheck(strm);
  iVar8 = -2;
  if (iVar3 == 0) {
    piVar1 = strm->state;
    uVar4 = strm->avail_in;
    if ((uVar4 != 0) || (iVar8 = -5, 7 < *(uint *)&piVar1->head)) {
      if (*(int *)&piVar1->pending_buf != 0x3f52) {
        *(undefined4 *)&piVar1->pending_buf = 0x3f52;
        uVar5 = *(uint *)&piVar1->head;
        pPVar6 = (Pos *)((ulong)piVar1->prev >> ((byte)uVar5 & 7));
        piVar1->prev = pPVar6;
        lVar7 = 0;
        if ((uVar5 & 0xfffffff8) != 0) {
          iVar3 = -(uVar5 & 0xfffffff8);
          lVar7 = 0;
          do {
            local_34[lVar7] = (uint8_t)pPVar6;
            lVar7 = lVar7 + 1;
            pPVar6 = (Pos *)((ulong)pPVar6 >> 8);
            iVar3 = iVar3 + 8;
          } while (iVar3 != 0);
          piVar1->prev = pPVar6;
        }
        *(undefined4 *)&piVar1->head = 0;
        *(undefined4 *)((long)&piVar1->update_hash + 4) = 0;
        syncsearch((uint32_t *)((long)&piVar1->update_hash + 4),local_34,(uint32_t)lVar7);
        uVar4 = strm->avail_in;
      }
      uVar4 = syncsearch((uint32_t *)((long)&piVar1->update_hash + 4),strm->next_in,uVar4);
      strm->avail_in = strm->avail_in - uVar4;
      strm->next_in = strm->next_in + uVar4;
      sVar9 = (ulong)uVar4 + strm->total_in;
      strm->total_in = sVar9;
      iVar8 = -3;
      if (*(int *)((long)&piVar1->update_hash + 4) == 4) {
        uVar4 = piVar1->pending_buf_size;
        iVar8 = 0;
        uVar5 = 0;
        if (uVar4 != 0xffffffff) {
          uVar5 = *(uint *)&piVar1->pending_out & 0xfffffffb;
        }
        *(uint *)&piVar1->pending_out = uVar5;
        sVar2 = strm->total_out;
        zng_inflateReset(strm);
        strm->total_in = sVar9;
        strm->total_out = sVar2;
        piVar1->pending_buf_size = uVar4;
        *(undefined4 *)&piVar1->pending_buf = 0x3f3f;
      }
    }
  }
  return iVar8;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateSync)(PREFIX3(stream) *strm) {
    struct inflate_state *state;
    size_t in, out;             /* temporary to save total_in and total_out */
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned char buf[4];       /* to restore bit buffer to byte string */

    /* check parameters */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8)
        return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold >>= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4)
        return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;
    out = strm->total_out;
    PREFIX(inflateReset)(strm);
    strm->total_in = (z_uintmax_t)in; /* Can't use z_size_t here as it will overflow on 64-bit Windows */
    strm->total_out = (z_uintmax_t)out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}